

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::BeamData::Encode(BeamData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  BeamData *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(float)this->m_f32AziCtr);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32AziSwp);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32EleCtr);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32EleSwp);
  KDataStream::operator<<(pKVar1,(float)this->m_f32SwpSyn);
  return;
}

Assistant:

void BeamData::Encode( KDataStream & stream ) const
{
    stream << m_f32AziCtr
           << m_f32AziSwp
           << m_f32EleCtr
           << m_f32EleSwp
           << m_f32SwpSyn;
}